

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O2

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapeQuad>::ComputeSolutionKernelHdivT<std::complex<double>>
          (TPZCompElKernelHDiv3D<pzshape::TPZShapeQuad> *this,
          TPZMaterialDataT<std::complex<double>_> *data)

{
  TPZSolVec<std::complex<double>_> *sol;
  TPZManVector<std::complex<double>,_10> *pTVar1;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar2;
  int iVar3;
  long *plVar4;
  TPZCompMesh *pTVar5;
  TPZFMatrix<std::complex<double>_> *pTVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  long local_70;
  complex<double> local_68;
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *local_50;
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *local_48;
  long local_40;
  long local_38;
  
  sol = &data->sol;
  local_50 = &data->curlsol;
  TPZCompElHCurl<pzshape::TPZShapeQuad>::ComputeSolutionHCurlT<std::complex<double>>
            (&this->super_TPZCompElHCurl<pzshape::TPZShapeQuad>,
             &(data->super_TPZMaterialData).phi.super_TPZFMatrix<double>,
             &(data->super_TPZMaterialData).curlphi.super_TPZFMatrix<double>,sol,local_50);
  plVar4 = (long *)(**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapeQuad>).
                                          super_TPZIntelGen<pzshape::TPZShapeQuad>.
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))(this);
  iVar3 = (**(code **)(*plVar4 + 0x78))(plVar4);
  (**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapeQuad>).
                         super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x90))(this);
  pTVar5 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar5->fSolution);
  if ((pTVar6->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol == 1) {
    local_48 = sol;
    TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize(sol,1);
    TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20>::Resize(&data->dsol,1);
    TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize(&data->divsol,1);
    lVar7 = (long)(iVar3 * 3);
    local_38 = (long)iVar3;
    local_70 = 0;
    lVar9 = 0;
    lVar8 = 1;
    local_40 = lVar7;
    while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
      pTVar1 = (data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      (**(code **)(*(long *)((long)&(((TPZManVector<std::complex<double>,_10> *)
                                     (pTVar1->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)
                                    ._vptr_TPZVec + lVar9) + 0x18))
                ((long)&(((TPZManVector<std::complex<double>,_10> *)(pTVar1->fExtAlloc + -2))->
                        super_TPZVec<std::complex<double>_>)._vptr_TPZVec + lVar9,lVar7);
      local_68._M_value._0_8_ = 0;
      local_68._M_value._8_8_ = 0;
      TPZVec<std::complex<double>_>::Fill
                ((TPZVec<std::complex<double>_> *)
                 ((long)&(((TPZManVector<std::complex<double>,_10> *)
                          (((data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore
                           )->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)._vptr_TPZVec +
                 lVar9),&local_68,0,-1);
      pTVar2 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore;
      (**(code **)(*(long *)((long)(&((TPZFMatrix<std::complex<double>_> *)
                                     (&((TPZFMatrix<std::complex<double>_> *)
                                       (&(pTVar2->super_TPZFMatrix<std::complex<double>_>).fPivot +
                                       -1))->fPivot + -1))->fPivot + 0xffffffffffffffff) + local_70)
                  + 0x70))
                ((long)(&((TPZFMatrix<std::complex<double>_> *)
                         (&((TPZFMatrix<std::complex<double>_> *)
                           (&(pTVar2->super_TPZFMatrix<std::complex<double>_>).fPivot + -1))->fPivot
                         + -1))->fPivot + 0xffffffffffffffff) + local_70,lVar7,3);
      pTVar1 = (data->divsol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      (**(code **)(*(long *)((long)&(((TPZManVector<std::complex<double>,_10> *)
                                     (pTVar1->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)
                                    ._vptr_TPZVec + lVar9) + 0x18))
                ((long)&(((TPZManVector<std::complex<double>,_10> *)(pTVar1->fExtAlloc + -2))->
                        super_TPZVec<std::complex<double>_>)._vptr_TPZVec + lVar9,local_38);
      local_68._M_value._0_8_ = 0;
      local_68._M_value._8_8_ = 0;
      TPZVec<std::complex<double>_>::Fill
                ((TPZVec<std::complex<double>_> *)
                 ((long)&(((TPZManVector<std::complex<double>,_10> *)
                          (((data->divsol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.
                           fStore)->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>).
                         _vptr_TPZVec + lVar9),&local_68,0,-1);
      lVar9 = lVar9 + 0xc0;
      local_70 = local_70 + 0x280;
    }
    TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::operator=(local_48,local_50);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElKernelHDiv3D.cpp"
             ,0xaf);
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeSolutionKernelHdivT(TPZMaterialDataT<TVar> &data)
{
    this->ComputeSolutionHCurlT(data.phi, data.curlphi,
                                data.sol, data.curlsol);

    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }
    data.sol = data.curlsol;

}